

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

size_t secp256k1_context_preallocated_clone_size(secp256k1_context *ctx)

{
  int iVar1;
  size_t local_18;
  size_t ret;
  secp256k1_context *ctx_local;
  
  secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx);
  local_18 = 0xe0;
  iVar1 = secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx);
  if (iVar1 != 0) {
    local_18 = 0x1000e0;
  }
  return local_18;
}

Assistant:

size_t secp256k1_context_preallocated_clone_size(const secp256k1_context* ctx) {
    size_t ret = ROUND_TO_ALIGN(sizeof(secp256k1_context));
    VERIFY_CHECK(ctx != NULL);
    if (secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)) {
        ret += SECP256K1_ECMULT_GEN_CONTEXT_PREALLOCATED_SIZE;
    }
    if (secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx)) {
        ret += SECP256K1_ECMULT_CONTEXT_PREALLOCATED_SIZE;
    }
    return ret;
}